

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrRecommendedLayerResolutionGetInfoMETA *value)

{
  pointer *this;
  pointer *this_00;
  XrResult XVar1;
  allocator local_601;
  string local_600 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5e0;
  allocator local_5c1;
  string local_5c0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5a0;
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [8];
  string error_message_8;
  XrCompositionLayerPassthroughHTC *new_compositionlayerpassthroughhtc_value;
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [8];
  string error_message_7;
  XrCompositionLayerPassthroughFB *new_compositionlayerpassthroughfb_value;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [8];
  string error_message_6;
  XrCompositionLayerEquirect2KHR *new_compositionlayerequirect2khr_value;
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [8];
  string error_message_5;
  XrCompositionLayerEquirectKHR *new_compositionlayerequirectkhr_value;
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [8];
  string error_message_4;
  XrCompositionLayerCylinderKHR *new_compositionlayercylinderkhr_value;
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [8];
  string error_message_3;
  XrCompositionLayerCubeKHR *new_compositionlayercubekhr_value;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [8];
  string error_message_2;
  XrCompositionLayerQuad *new_compositionlayerquad_value;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [8];
  string error_message_1;
  XrCompositionLayerProjection *new_compositionlayerprojection_value;
  string local_218 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrRecommendedLayerResolutionGetInfoMETA *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrRecommendedLayerResolutionGetInfoMETA",
               value->type,"VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type",
               XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META,
               "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrRecommendedLayerResolutionGetInfoMETA : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    if (value->layer == (XrCompositionLayerBaseHeader *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_1d9
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_218,
                 "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not optional and must be non-NULL"
                 ,(allocator *)((long)&new_compositionlayerprojection_value + 7));
      CoreValidLogMessage(instance_info,(string *)local_1d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1f8,(string *)local_218);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&new_compositionlayerprojection_value + 7));
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1f8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if ((((XrCompositionLayerProjection *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_PROJECTION) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerProjection *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_248,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_249);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::__cxx11::string::operator+=(local_248," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_270,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_271
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerquad_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_270,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayerquad_value,(string *)local_248);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerquad_value);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_248);
    }
    else if ((((XrCompositionLayerQuad *)value->layer)->type == XR_TYPE_COMPOSITION_LAYER_QUAD) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerQuad *)value->layer), XVar1 != XR_SUCCESS))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b8,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_2b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::__cxx11::string::operator+=(local_2b8," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e0,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_2e1
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayercubekhr_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_2e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayercubekhr_value,(string *)local_2b8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayercubekhr_value);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_2b8);
    }
    else if ((((XrCompositionLayerCubeKHR *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerCubeKHR *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_329);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::__cxx11::string::operator+=(local_328," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_350,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_351
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayercylinderkhr_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayercylinderkhr_value,(string *)local_328);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayercylinderkhr_value);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_328);
    }
    else if ((((XrCompositionLayerCylinderKHR *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerCylinderKHR *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_398,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_399);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      std::__cxx11::string::operator+=(local_398," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c0,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_3c1
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerequirectkhr_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_3c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayerequirectkhr_value,(string *)local_398);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerequirectkhr_value);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_398);
    }
    else if ((((XrCompositionLayerEquirectKHR *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerEquirectKHR *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_408,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_409);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      std::__cxx11::string::operator+=(local_408," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_430,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_431
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerequirect2khr_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_430,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayerequirect2khr_value,(string *)local_408);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerequirect2khr_value);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_408);
    }
    else if ((((XrCompositionLayerEquirect2KHR *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerEquirect2KHR *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_478,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_479);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      std::__cxx11::string::operator+=(local_478," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4a0,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_4a1
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerpassthroughfb_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_4a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayerpassthroughfb_value,(string *)local_478);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerpassthroughfb_value);
      std::__cxx11::string::~string(local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_478);
    }
    else if ((((XrCompositionLayerPassthroughFB *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerPassthroughFB *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4e8,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_4e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      std::__cxx11::string::operator+=(local_4e8," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_510,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_511
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerpassthroughhtc_value,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_510,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_compositionlayerpassthroughhtc_value,(string *)local_4e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_compositionlayerpassthroughhtc_value);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_4e8);
    }
    else if ((((XrCompositionLayerPassthroughHTC *)value->layer)->type ==
              XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) &&
            (XVar1 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      (XrCompositionLayerPassthroughHTC *)value->layer),
            XVar1 != XR_SUCCESS)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_558,"Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                 &local_559);
      std::allocator<char>::~allocator((allocator<char> *)&local_559);
      std::__cxx11::string::operator+=(local_558," is invalid");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_580,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",&local_581
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_5a0,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_580,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_5a0,(string *)local_558);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_5a0);
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_558);
    }
    else {
      instance_info_local._4_4_ =
           ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,value->layer)
      ;
      if (instance_info_local._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5c0,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   &local_5c1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_5e0,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_600,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid",
                   &local_601);
        CoreValidLogMessage(instance_info,(string *)local_5c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_5e0,(string *)local_600);
        std::__cxx11::string::~string(local_600);
        std::allocator<char>::~allocator((allocator<char> *)&local_601);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_5e0);
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      }
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrRecommendedLayerResolutionGetInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrRecommendedLayerResolutionGetInfoMETA",
                             value->type, "VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type", XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META, "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrRecommendedLayerResolutionGetInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional pointer/array variable that needs to not be NULL
    if (nullptr == value->layer) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not "
                            "optional and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
    {
        const XrCompositionLayerProjection* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection*>(value->layer);
        if (new_compositionlayerprojection_value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerprojection_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
    {
        const XrCompositionLayerQuad* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad*>(value->layer);
        if (new_compositionlayerquad_value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerquad_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
    {
        const XrCompositionLayerCubeKHR* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value->layer);
        if (new_compositionlayercubekhr_value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercubekhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
    {
        const XrCompositionLayerCylinderKHR* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value->layer);
        if (new_compositionlayercylinderkhr_value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
    {
        const XrCompositionLayerEquirectKHR* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value->layer);
        if (new_compositionlayerequirectkhr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
    {
        const XrCompositionLayerEquirect2KHR* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value->layer);
        if (new_compositionlayerequirect2khr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
    {
        const XrCompositionLayerPassthroughFB* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value->layer);
        if (new_compositionlayerpassthroughfb_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
    {
        const XrCompositionLayerPassthroughHTC* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value->layer);
        if (new_compositionlayerpassthroughhtc_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate that the base-structure XrCompositionLayerBaseHeader is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, value->layer);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}